

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doCheck(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  Pipeline *pPVar6;
  element_type *cstr;
  runtime_error *this_00;
  size_t in_RCX;
  void *__buf;
  shared_ptr<Pipeline> local_170;
  vector<QPDFExc,_std::allocator<QPDFExc>_> local_160 [2];
  exception *e;
  QPDFExc *e_1;
  QPDFPageObjectHelper *page;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_e0;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_c8;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  int pageno;
  DiscardContents discard_contents;
  Pl_Discard discard;
  QPDFWriter w;
  __shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> local_38 [4];
  int extension_level;
  element_type *local_28;
  element_type *cout;
  QPDF *pQStack_18;
  bool okay;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  cout._7_1_ = 1;
  pQStack_18 = pdf;
  pdf_local = (QPDF *)this;
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar3);
  QPDFLogger::getInfo((QPDFLogger *)local_38,SUB81(peVar4,0));
  peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     (local_38);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_38);
  local_28 = peVar5;
  pPVar6 = Pipeline::operator<<(peVar5,"checking ");
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  cstr = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                   (&(peVar3->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  pPVar6 = Pipeline::operator<<(pPVar6,cstr);
  Pipeline::operator<<(pPVar6,"\n");
  QPDF::JobSetter::setCheckMode(pQStack_18,true);
  iVar2 = QPDF::getExtensionLevel(pQStack_18);
  pPVar6 = Pipeline::operator<<(local_28,"PDF Version: ");
  QPDF::getPDFVersion_abi_cxx11_
            ((string *)
             &w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pQStack_18);
  Pipeline::operator<<
            (pPVar6,(string *)
                    &w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &w.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (0 < iVar2) {
    pPVar6 = Pipeline::operator<<(local_28," extension level ");
    iVar2 = QPDF::getExtensionLevel(pQStack_18);
    Pipeline::operator<<(pPVar6,iVar2);
  }
  Pipeline::operator<<(local_28,"\n");
  showEncryption(this,pQStack_18);
  bVar1 = QPDF::isLinearized(pQStack_18);
  if (bVar1) {
    Pipeline::operator<<(local_28,"File is linearized\n");
    QPDF::checkLinearization(pQStack_18);
  }
  else {
    Pipeline::operator<<(local_28,"File is not linearized\n");
  }
  QPDFWriter::QPDFWriter((QPDFWriter *)&discard.super_Pipeline.next_,pQStack_18);
  Pl_Discard::Pl_Discard((Pl_Discard *)&discard_contents);
  QPDFWriter::setOutputPipeline
            ((QPDFWriter *)&discard.super_Pipeline.next_,(Pipeline *)&discard_contents);
  iVar2 = 3;
  QPDFWriter::setDecodeLevel((QPDFWriter *)&discard.super_Pipeline.next_,qpdf_dl_all);
  QPDFWriter::write((QPDFWriter *)&discard.super_Pipeline.next_,iVar2,__buf,in_RCX);
  anon_unknown.dwarf_246be4::DiscardContents::DiscardContents
            ((DiscardContents *)&stack0xffffffffffffff48);
  __range1._4_4_ = 0;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1,pQStack_18);
  QPDFPageDocumentHelper::getAllPages(&local_e0,(QPDFPageDocumentHelper *)&__begin1);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1);
  local_c8 = &local_e0;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_c8)
  ;
  page = (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_c8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&page);
    if (!bVar1) break;
    e_1 = (QPDFExc *)
          __gnu_cxx::
          __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
          ::operator*(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
    QPDFPageObjectHelper::parseContents
              ((QPDFPageObjectHelper *)e_1,(ParserCallbacks *)&stack0xffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_e0);
  anon_unknown.dwarf_246be4::DiscardContents::~DiscardContents
            ((DiscardContents *)&stack0xffffffffffffff48);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&discard_contents);
  QPDFWriter::~QPDFWriter((QPDFWriter *)&discard.super_Pipeline.next_);
  if ((cout._7_1_ & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"errors detected");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  QPDF::getWarnings(local_160,pQStack_18);
  bVar1 = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::empty(local_160);
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(local_160);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )peVar3);
    QPDFLogger::getInfo((QPDFLogger *)&local_170,SUB81(peVar4,0));
    peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_170);
    pPVar6 = Pipeline::operator<<
                       (peVar5,
                        "No syntax or stream encoding errors found; the file may still contain\n");
    Pipeline::operator<<(pPVar6,"errors that qpdf cannot detect\n");
    std::shared_ptr<Pipeline>::~shared_ptr(&local_170);
  }
  else {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar3->warnings = true;
  }
  return;
}

Assistant:

void
QPDFJob::doCheck(QPDF& pdf)
{
    // Code below may set okay to false but not to true. We assume okay until we prove otherwise but
    // may continue to perform additional checks after finding errors.
    bool okay = true;
    auto& cout = *m->log->getInfo();
    cout << "checking " << m->infilename.get() << "\n";
    QPDF::JobSetter::setCheckMode(pdf, true);
    try {
        int extension_level = pdf.getExtensionLevel();
        cout << "PDF Version: " << pdf.getPDFVersion();
        if (extension_level > 0) {
            cout << " extension level " << pdf.getExtensionLevel();
        }
        cout << "\n";
        showEncryption(pdf);
        if (pdf.isLinearized()) {
            cout << "File is linearized\n";
            pdf.checkLinearization();
        } else {
            cout << "File is not linearized\n";
        }

        // Write the file to nowhere, uncompressing streams.  This causes full file traversal and
        // decoding of all streams we can decode.
        QPDFWriter w(pdf);
        Pl_Discard discard;
        w.setOutputPipeline(&discard);
        w.setDecodeLevel(qpdf_dl_all);
        w.write();

        // Parse all content streams
        DiscardContents discard_contents;
        int pageno = 0;
        for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
            ++pageno;
            try {
                page.parseContents(&discard_contents);
            } catch (QPDFExc& e) {
                okay = false;
                *m->log->getError() << "ERROR: page " << pageno << ": " << e.what() << "\n";
            }
        }
    } catch (std::exception& e) {
        *m->log->getError() << "ERROR: " << e.what() << "\n";
        okay = false;
    }
    if (!okay) {
        throw std::runtime_error("errors detected");
    }

    if (!pdf.getWarnings().empty()) {
        m->warnings = true;
    } else {
        *m->log->getInfo()
            << "No syntax or stream encoding errors found; the file may still contain\n"
            << "errors that qpdf cannot detect\n";
    }
}